

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

void capnp::_::PointerHelpers<capnp::List<double,_(capnp::Kind)0>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_double> value)

{
  StructDataBitCount *this;
  size_t sVar1;
  double *pdVar2;
  double *element;
  double *__end0;
  double *__begin0;
  ArrayPtr<const_double> *__range3;
  uint i;
  undefined1 local_40 [8];
  Builder l;
  ArrayPtr<const_double> value_local;
  
  l.builder._32_8_ = value.ptr;
  sVar1 = kj::ArrayPtr<const_double>::size((ArrayPtr<const_double> *)&l.builder.structDataSize);
  init((PointerHelpers<capnp::List<double,_(capnp::Kind)0>,_(capnp::Kind)6> *)local_40,
       (EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
  __range3._4_4_ = 0;
  this = &l.builder.structDataSize;
  __end0 = kj::ArrayPtr<const_double>::begin((ArrayPtr<const_double> *)this);
  pdVar2 = kj::ArrayPtr<const_double>::end((ArrayPtr<const_double> *)this);
  for (; __end0 != pdVar2; __end0 = __end0 + 1) {
    List<double,_(capnp::Kind)0>::Builder::set((Builder *)local_40,__range3._4_4_,*__end0);
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }